

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t
exr_attr_string_vector_copy
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,exr_attr_string_vector_t *src)

{
  uint uVar1;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  exr_attr_string_vector_t *in_RDI;
  exr_attr_string_vector_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  int i;
  exr_result_t rv;
  uint in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  int32_t in_stack_fffffffffffffffc;
  exr_result_t eVar3;
  
  if (in_RDX == (exr_attr_string_t *)0x0) {
    eVar3 = 3;
  }
  else {
    eVar3 = exr_attr_string_vector_init(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc);
    iVar2 = 0;
    while( true ) {
      uVar1 = in_stack_ffffffffffffffd4 & 0xffffff;
      if (eVar3 == 0) {
        uVar1 = CONCAT13(iVar2 < in_RDX->length,(int3)in_stack_ffffffffffffffd4);
      }
      in_stack_ffffffffffffffd4 = uVar1;
      if ((char)(in_stack_ffffffffffffffd4 >> 0x18) == '\0') break;
      eVar3 = exr_attr_string_set_with_length
                        (in_RSI,in_RDX,(char *)CONCAT44(eVar3,iVar2),in_stack_ffffffffffffffd4);
      iVar2 = iVar2 + 1;
    }
    if (eVar3 != 0) {
      exr_attr_string_vector_destroy
                ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                );
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_string_vector_copy (
    exr_context_t                   ctxt,
    exr_attr_string_vector_t*       sv,
    const exr_attr_string_vector_t* src)
{
    exr_result_t rv;

    if (!src) return EXR_ERR_INVALID_ARGUMENT;
    rv = exr_attr_string_vector_init (ctxt, sv, src->n_strings);
    for (int i = 0; rv == EXR_ERR_SUCCESS && i < src->n_strings; ++i)
    {
        rv = exr_attr_string_set_with_length (
            ctxt,
            EXR_CONST_CAST (exr_attr_string_t*, sv->strings + i),
            src->strings[i].str,
            src->strings[i].length);
    }
    if (rv != EXR_ERR_SUCCESS) exr_attr_string_vector_destroy (ctxt, sv);
    return rv;
}